

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::CreateAnimation
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pName)

{
  pointer *this_00;
  size_t sVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined8 uVar4;
  pointer __src;
  pointer ppaVar5;
  pointer __src_00;
  pointer ppaVar6;
  size_type sVar7;
  bool bVar8;
  __type _Var9;
  size_t a_2;
  pointer ppaVar10;
  Node *pNVar11;
  long lVar12;
  Logger *pLVar13;
  Accessor *pAVar14;
  Data *pDVar15;
  pointer pTVar16;
  void *pvVar17;
  undefined8 *puVar18;
  aiMeshMorphAnim *paVar19;
  long lVar20;
  const_reference pvVar21;
  ulong *puVar22;
  uint *puVar23;
  ulong uVar24;
  double *pdVar25;
  aiAnimation *this_01;
  aiNodeAnim **__dest;
  aiMeshMorphAnim **__dest_00;
  DeadlyImportError *this_02;
  _Base_ptr p_Var26;
  undefined8 *puVar27;
  size_t c;
  pointer pCVar28;
  ulong uVar29;
  uint uVar30;
  char cVar31;
  ColladaParser *this_03;
  ColladaLoader *this_04;
  size_t a_1;
  ulong uVar32;
  pointer paVar33;
  size_t a;
  pointer paVar34;
  uint uVar35;
  size_t pos;
  pointer pAVar36;
  long lVar37;
  string *psVar38;
  size_t __n;
  ai_real aVar39;
  float fVar40;
  ai_real aVar41;
  float fVar42;
  ai_real aVar43;
  ai_real aVar44;
  float fVar45;
  float fVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  aiMeshMorphAnim *morphAnim;
  string subElement;
  vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> transforms;
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> entries;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> resultTrafos;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Base_ptr local_2c0;
  _Alloc_hider _Stack_2b8;
  Accessor *local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2a8;
  Data *pDStack_298;
  _Alloc_hider local_290;
  _Base_ptr local_288;
  undefined1 local_280 [8];
  vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> morphAnims;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  string targetID;
  string nodeName;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> nodes;
  aiMatrix4x4 mat;
  
  nodes.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  nodes.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  nodes.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_290._M_p = (pointer)this;
  CollectNodes(this,pScene->mRootNode,&nodes);
  anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_280 = (undefined1  [8])&pParser->mAccessorLibrary;
  local_288 = (_Base_ptr)&pParser->mDataLibrary;
  ppaVar10 = nodes.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    if (ppaVar10 ==
        nodes.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        this_01 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_01);
        uVar32 = pName->_M_string_length;
        mat._0_8_ = this_01;
        if (uVar32 < 0x400) {
          (this_01->mName).length = (ai_uint32)uVar32;
          memcpy((this_01->mName).data,(pName->_M_dataplus)._M_p,uVar32);
          (this_01->mName).data[uVar32] = '\0';
        }
        ppaVar6 = anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        __src_00 = anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        __n = (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        uVar32 = (long)__n >> 3;
        this_01->mNumChannels = (uint)uVar32;
        if ((uint)uVar32 != 0) {
          uVar29 = 0xffffffffffffffff;
          if (uVar32 < 0x2000000000000000) {
            uVar29 = __n;
          }
          __dest = (aiNodeAnim **)operator_new__(uVar29);
          this_01->mChannels = __dest;
          if (ppaVar6 != __src_00) {
            memmove(__dest,__src_00,__n);
          }
        }
        ppaVar5 = morphAnims.
                  super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        __src = morphAnims.super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
        uVar29 = (long)morphAnims.
                       super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)morphAnims.
                       super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar30 = (uint)(uVar29 >> 3);
        this_01->mNumMorphMeshChannels = uVar30;
        if (uVar30 != 0) {
          __dest_00 = (aiMeshMorphAnim **)operator_new__(uVar29 & 0x7fffffff8);
          this_01->mMorphMeshChannels = __dest_00;
          if (ppaVar5 != __src) {
            memmove(__dest_00,__src,uVar29);
          }
        }
        this_01->mDuration = 0.0;
        uVar47 = 0;
        uVar48 = 0;
        for (uVar24 = 0; uVar32 != uVar24; uVar24 = uVar24 + 1) {
          dVar3 = __src_00[uVar24]->mPositionKeys[__src_00[uVar24]->mNumPositionKeys - 1].mTime;
          uVar49 = SUB84(dVar3,0);
          uVar50 = (int)((ulong)dVar3 >> 0x20);
          if (dVar3 <= (double)CONCAT44(uVar48,uVar47)) {
            uVar49 = uVar47;
            uVar50 = uVar48;
          }
          this_01->mDuration = (double)CONCAT44(uVar50,uVar49);
          dVar3 = __src_00[uVar24]->mRotationKeys[__src_00[uVar24]->mNumRotationKeys - 1].mTime;
          uVar51 = SUB84(dVar3,0);
          uVar52 = (int)((ulong)dVar3 >> 0x20);
          if (dVar3 <= (double)CONCAT44(uVar50,uVar49)) {
            uVar51 = uVar49;
            uVar52 = uVar50;
          }
          this_01->mDuration = (double)CONCAT44(uVar52,uVar51);
          dVar3 = __src_00[uVar24]->mScalingKeys[__src_00[uVar24]->mNumScalingKeys - 1].mTime;
          uVar47 = SUB84(dVar3,0);
          uVar48 = (int)((ulong)dVar3 >> 0x20);
          if (dVar3 <= (double)CONCAT44(uVar52,uVar51)) {
            uVar47 = uVar51;
            uVar48 = uVar52;
          }
          this_01->mDuration = (double)CONCAT44(uVar48,uVar47);
        }
        for (lVar12 = 0; (long)uVar29 >> 3 != lVar12; lVar12 = lVar12 + 1) {
          dVar3 = __src[lVar12]->mKeys[__src[lVar12]->mNumKeys - 1].mTime;
          uVar49 = SUB84(dVar3,0);
          uVar50 = (int)((ulong)dVar3 >> 0x20);
          if (dVar3 <= (double)CONCAT44(uVar48,uVar47)) {
            uVar49 = uVar47;
            uVar50 = uVar48;
          }
          uVar48 = uVar50;
          uVar47 = uVar49;
          this_01->mDuration = (double)CONCAT44(uVar48,uVar47);
        }
        this_01->mTicksPerSecond = 1.0;
        std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::push_back
                  ((vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *)(local_290._M_p + 0x188)
                   ,(value_type *)&mat);
      }
      std::_Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::~_Vector_base
                (&morphAnims.
                  super__Vector_base<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>);
      std::_Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::~_Vector_base
                (&anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>);
      std::_Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>::~_Vector_base
                (&nodes.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>);
      return;
    }
    entries.
    super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    entries.
    super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entries.
    super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::string::string((string *)&nodeName,((*ppaVar10)->mName).data,(allocator *)&mat);
    pNVar11 = FindNode((ColladaLoader *)local_290._M_p,pParser->mRootNode,&nodeName);
    if (pNVar11 != (Node *)0x0) {
      targetID._M_dataplus._M_p = (pointer)&targetID.field_2;
      targetID._M_string_length = 0;
      targetID.field_2._M_local_buf[0] = '\0';
      subElement._M_dataplus._M_p = (pointer)&subElement.field_2;
      subElement._M_string_length = 0;
      subElement.field_2._M_local_buf[0] = '\0';
      for (pAVar36 = (pSrcAnim->mChannels).
                     super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pAVar36 !=
          (pSrcAnim->mChannels).
          super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
          ._M_impl.super__Vector_impl_data._M_finish; pAVar36 = pAVar36 + 1) {
        resultTrafos.super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        resultTrafos.super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_2f0;
        resultTrafos.super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2f0._M_local_buf[0] = '\0';
        local_2e0._M_allocated_capacity = (size_type)&local_2d0;
        local_2e0._8_8_ = 0;
        local_2d0._M_local_buf[0] = '\0';
        aStack_2a8._8_8_ = (Accessor *)0x0;
        pDStack_298 = (Data *)0x0;
        local_2b0 = (Accessor *)0x0;
        aStack_2a8._M_allocated_capacity = 0;
        local_2c0 = (_Base_ptr)0x0;
        _Stack_2b8._M_p = (pointer)0x0;
        cVar31 = (char)pAVar36;
        lVar12 = std::__cxx11::string::find(cVar31,0x2f);
        if (lVar12 == -1) {
          lVar12 = std::__cxx11::string::find((string *)pAVar36,(ulong)&pNVar11->mID);
          if (lVar12 != -1) {
            resultTrafos.
            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)pAVar36;
            std::__cxx11::string::substr((ulong)&mat,(ulong)pAVar36);
            this_00 = &resultTrafos.
                       super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            std::__cxx11::string::operator=((string *)this_00,(string *)&mat);
            std::__cxx11::string::~string((string *)&mat);
            if (*(char *)&(resultTrafos.
                           super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->a1 == '-') {
              std::__cxx11::string::substr((ulong)&mat,(ulong)this_00);
              std::__cxx11::string::operator=((string *)this_00,(string *)&mat);
              std::__cxx11::string::~string((string *)&mat);
            }
            std::
            vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
            push_back(&entries,(value_type *)&resultTrafos);
          }
        }
        else {
          lVar12 = std::__cxx11::string::find(cVar31,0x2f);
          if (lVar12 == -1) {
            targetID._M_string_length = 0;
            *targetID._M_dataplus._M_p = '\0';
            std::__cxx11::string::substr((ulong)&mat,(ulong)pAVar36);
            std::__cxx11::string::operator=((string *)&targetID,(string *)&mat);
            std::__cxx11::string::~string((string *)&mat);
            bVar8 = std::operator!=(&targetID,&pNVar11->mID);
            if (!bVar8) {
              lVar12 = std::__cxx11::string::find(cVar31,0x2e);
              if (lVar12 == -1) {
                std::__cxx11::string::substr((ulong)&mat,(ulong)pAVar36);
                std::__cxx11::string::operator=((string *)local_2e0._M_local_buf,(string *)&mat);
                std::__cxx11::string::~string((string *)&mat);
              }
              else {
                lVar12 = std::__cxx11::string::find(cVar31,0x2e);
                if (lVar12 != -1) goto LAB_003dfe8f;
                std::__cxx11::string::substr((ulong)&mat,(ulong)pAVar36);
                std::__cxx11::string::operator=((string *)local_2e0._M_local_buf,(string *)&mat);
                std::__cxx11::string::~string((string *)&mat);
                subElement._M_string_length = 0;
                *subElement._M_dataplus._M_p = '\0';
                std::__cxx11::string::substr((ulong)&mat,(ulong)pAVar36);
                std::__cxx11::string::operator=((string *)&subElement,(string *)&mat);
                std::__cxx11::string::~string((string *)&mat);
                bVar8 = std::operator==(&subElement,"ANGLE");
                if (bVar8) {
                  _Stack_2b8._M_p = (pointer)0x3;
                }
                else {
                  bVar8 = std::operator==(&subElement,"X");
                  if (bVar8) {
                    _Stack_2b8._M_p = (pointer)0x0;
                  }
                  else {
                    bVar8 = std::operator==(&subElement,"Y");
                    if (bVar8) {
                      _Stack_2b8._M_p = (pointer)0x1;
                    }
                    else {
                      bVar8 = std::operator==(&subElement,"Z");
                      if (bVar8) {
                        _Stack_2b8._M_p = (pointer)0x2;
                      }
                      else {
                        pLVar13 = DefaultLogger::get();
                        Formatter::
                        basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                        basic_formatter<char[26]>
                                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&mat,(char (*) [26])"Unknown anim subelement <");
                        std::operator<<((ostream *)&mat,(string *)&subElement);
                        std::operator<<((ostream *)&mat,">. Ignoring");
                        std::__cxx11::stringbuf::str();
                        Logger::warn(pLVar13,(char *)transforms.
                                                                                                          
                                                  super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        std::__cxx11::string::~string((string *)&transforms);
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mat);
                      }
                    }
                  }
                }
              }
              lVar12 = std::__cxx11::string::find(cVar31,0x28);
              if (lVar12 != -1) {
                std::__cxx11::string::substr((ulong)&mat,(ulong)pAVar36);
                std::__cxx11::string::operator=((string *)local_2e0._M_local_buf,(string *)&mat);
                std::__cxx11::string::~string((string *)&mat);
                subElement._M_string_length = 0;
                *subElement._M_dataplus._M_p = '\0';
                std::__cxx11::string::substr((ulong)&mat,(ulong)pAVar36);
                std::__cxx11::string::operator=((string *)&subElement,(string *)&mat);
                std::__cxx11::string::~string((string *)&mat);
                bVar8 = std::operator==(&subElement,"(0)(0)");
                if (bVar8) {
                  p_Var26 = (_Base_ptr)0x0;
                }
                else {
                  bVar8 = std::operator==(&subElement,"(1)(0)");
                  p_Var26 = (_Base_ptr)0x1;
                  if (!bVar8) {
                    bVar8 = std::operator==(&subElement,"(2)(0)");
                    p_Var26 = (_Base_ptr)0x2;
                    if (!bVar8) {
                      bVar8 = std::operator==(&subElement,"(3)(0)");
                      p_Var26 = (_Base_ptr)0x3;
                      if (!bVar8) {
                        bVar8 = std::operator==(&subElement,"(0)(1)");
                        p_Var26 = (_Base_ptr)0x4;
                        if (!bVar8) {
                          bVar8 = std::operator==(&subElement,"(1)(1)");
                          p_Var26 = (_Base_ptr)0x5;
                          if (!bVar8) {
                            bVar8 = std::operator==(&subElement,"(2)(1)");
                            p_Var26 = (_Base_ptr)0x6;
                            if (!bVar8) {
                              bVar8 = std::operator==(&subElement,"(3)(1)");
                              p_Var26 = (_Base_ptr)0x7;
                              if (!bVar8) {
                                bVar8 = std::operator==(&subElement,"(0)(2)");
                                p_Var26 = (_Base_ptr)0x8;
                                if (!bVar8) {
                                  bVar8 = std::operator==(&subElement,"(1)(2)");
                                  p_Var26 = (_Base_ptr)0x9;
                                  if (!bVar8) {
                                    bVar8 = std::operator==(&subElement,"(2)(2)");
                                    p_Var26 = (_Base_ptr)0xa;
                                    if (!bVar8) {
                                      bVar8 = std::operator==(&subElement,"(3)(2)");
                                      p_Var26 = (_Base_ptr)0xb;
                                      if (!bVar8) {
                                        bVar8 = std::operator==(&subElement,"(0)(3)");
                                        p_Var26 = (_Base_ptr)0xc;
                                        if (!bVar8) {
                                          bVar8 = std::operator==(&subElement,"(1)(3)");
                                          p_Var26 = (_Base_ptr)0xd;
                                          if (!bVar8) {
                                            bVar8 = std::operator==(&subElement,"(2)(3)");
                                            p_Var26 = (_Base_ptr)0xe;
                                            if (!bVar8) {
                                              bVar8 = std::operator==(&subElement,"(3)(3)");
                                              p_Var26 = (_Base_ptr)0xf;
                                              if (!bVar8) goto LAB_003dfdd1;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                _Stack_2b8._M_p = (pointer)p_Var26;
              }
LAB_003dfdd1:
              local_2c0 = (_Base_ptr)0xffffffffffffffff;
              lVar12 = 0;
              for (p_Var26 = (_Base_ptr)0x0;
                  pTVar16 = (pNVar11->mTransforms).
                            super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  p_Var26 < (_Base_ptr)
                            (((long)(pNVar11->mTransforms).
                                    super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar16) /
                            0x68); p_Var26 = (_Base_ptr)((long)&p_Var26->_M_color + 1)) {
                _Var9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)pTVar16->f + lVar12 + -0x24),
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&local_2e0);
                if (_Var9) {
                  local_2c0 = p_Var26;
                }
                lVar12 = lVar12 + 0x68;
              }
              if (local_2c0 == (_Base_ptr)0xffffffffffffffff) {
                lVar12 = std::__cxx11::string::find(local_2e0._M_local_buf,0x5a644d);
                if (lVar12 == -1) goto LAB_003dfe8f;
                std::__cxx11::string::_M_assign
                          ((string *)
                           &resultTrafos.
                            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
                std::__cxx11::string::assign(local_2e0._M_local_buf);
              }
              resultTrafos.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)pAVar36;
              std::
              vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ::push_back(&entries,(value_type *)&resultTrafos);
            }
          }
        }
LAB_003dfe8f:
        Collada::ChannelEntry::~ChannelEntry((ChannelEntry *)&resultTrafos);
      }
      if (entries.
          super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          entries.
          super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        fVar46 = 1e+20;
        for (pCVar28 = entries.
                       super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            pCVar28 !=
            entries.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish; pCVar28 = pCVar28 + 1) {
          pAVar14 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pParser,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
                                        *)local_280,&pCVar28->mChannel->mSourceTimes);
          pCVar28->mTimeAccessor = pAVar14;
          pDVar15 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pParser,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
                                        *)local_288,&pAVar14->mSource);
          pCVar28->mTimeData = pDVar15;
          pAVar14 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pParser,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
                                        *)local_280,&pCVar28->mChannel->mSourceValues);
          pCVar28->mValueAccessor = pAVar14;
          this_03 = pParser;
          pDVar15 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pParser,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
                                        *)local_288,&pAVar14->mSource);
          pCVar28->mValueData = pDVar15;
          sVar1 = pCVar28->mTimeAccessor->mCount;
          if (sVar1 != pCVar28->mValueAccessor->mCount) {
            this_02 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&mat);
            std::operator<<((ostream *)&mat,
                            "Time count / value count mismatch in animation channel \"");
            std::operator<<((ostream *)&mat,(string *)pCVar28->mChannel);
            std::operator<<((ostream *)&mat,"\".");
            std::__cxx11::stringbuf::str();
            DeadlyImportError::DeadlyImportError(this_02,(string *)&resultTrafos);
            __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (sVar1 != 0) {
            aVar39 = ReadFloat((ColladaLoader *)this_03,pCVar28->mTimeAccessor,pCVar28->mTimeData,0,
                               0);
            if (fVar46 <= aVar39) {
              aVar39 = fVar46;
            }
            ReadFloat((ColladaLoader *)this_03,pCVar28->mTimeAccessor,pCVar28->mTimeData,
                      pCVar28->mTimeAccessor->mCount - 1,0);
            fVar46 = aVar39;
          }
        }
        resultTrafos.super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        resultTrafos.super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        resultTrafos.super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((entries.
             super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             entries.
             super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           ((entries.
             super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount == 0)) {
LAB_003e0630:
          pLVar13 = DefaultLogger::get();
          Logger::warn(pLVar13,
                       "Collada loader: found empty animation channel, ignored. Please check your exporter."
                      );
        }
        else {
          this_04 = (ColladaLoader *)&transforms;
          std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
          vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> *)
                 this_04,&pNVar11->mTransforms);
          pCVar28 = entries.
                    super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            for (; pCVar28 !=
                   entries.
                   super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pCVar28 = pCVar28 + 1) {
              fVar40 = 0.0;
              uVar32 = 0;
              while( true ) {
                uVar29 = pCVar28->mTimeAccessor->mCount;
                if (uVar29 <= uVar32) break;
                fVar40 = ReadFloat(this_04,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar32,0);
                if (fVar46 <= fVar40) {
                  uVar29 = pCVar28->mTimeAccessor->mCount;
                  break;
                }
                uVar32 = uVar32 + 1;
              }
              uVar24 = uVar29 - 1;
              if (uVar32 <= uVar29 - 1) {
                uVar24 = uVar32;
              }
              uVar32 = 0;
              while( true ) {
                uVar29 = pCVar28->mValueAccessor->mSize;
                if (uVar29 <= uVar32) break;
                aVar39 = ReadFloat(this_04,pCVar28->mValueAccessor,pCVar28->mValueData,uVar24,uVar32
                                  );
                (&mat.a1)[uVar32] = aVar39;
                uVar32 = uVar32 + 1;
              }
              if ((fVar46 < fVar40) && (uVar24 != 0)) {
                aVar39 = ReadFloat(this_04,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar24 - 1,0);
                uVar32 = 0;
                while( true ) {
                  uVar29 = pCVar28->mValueAccessor->mSize;
                  if (uVar29 <= uVar32) break;
                  aVar41 = ReadFloat(this_04,pCVar28->mValueAccessor,pCVar28->mValueData,uVar24 - 1,
                                     uVar32);
                  (&mat.a1)[uVar32] =
                       (aVar41 - (&mat.a1)[uVar32]) * ((fVar46 - fVar40) / (aVar39 - fVar40)) +
                       (&mat.a1)[uVar32];
                  uVar32 = uVar32 + 1;
                }
              }
              if (uVar29 != 0) {
                this_04 = (ColladaLoader *)
                          (transforms.
                           super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                           ._M_impl.super__Vector_impl_data._M_start[pCVar28->mTransformIndex].f +
                          pCVar28->mSubElement);
                memcpy(this_04,&mat,uVar29 << 2);
              }
            }
            ColladaParser::CalculateResultTransform(&mat,pParser,&transforms);
            mat.d4 = fVar46;
            this_04 = (ColladaLoader *)&resultTrafos;
            std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::push_back
                      ((vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *)this_04
                       ,&mat);
            fVar40 = 1e+20;
            for (pCVar28 = entries.
                           super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pCVar28 !=
                entries.
                super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish; pCVar28 = pCVar28 + 1) {
              for (uVar32 = 0; fVar42 = fVar40, uVar32 < pCVar28->mTimeAccessor->mCount;
                  uVar32 = uVar32 + 1) {
                fVar42 = ReadFloat(this_04,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar32,0);
                if (fVar46 < fVar42) {
                  if (fVar40 <= fVar42) {
                    fVar42 = fVar40;
                  }
                  break;
                }
              }
              fVar40 = fVar42;
              if ((((transforms.
                     super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                     ._M_impl.super__Vector_impl_data._M_start[pCVar28->mTransformIndex].mType ==
                     TF_ROTATE) && (uVar32 != 0)) && (pCVar28->mSubElement == 3)) &&
                 (uVar32 < pCVar28->mTimeAccessor->mCount)) {
                aVar39 = ReadFloat(this_04,pCVar28->mValueAccessor,pCVar28->mValueData,uVar32,0);
                aVar41 = ReadFloat(this_04,pCVar28->mValueAccessor,pCVar28->mValueData,uVar32 - 1,0)
                ;
                aVar43 = ReadFloat(this_04,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar32,0);
                aVar44 = ReadFloat(this_04,pCVar28->mTimeAccessor,pCVar28->mTimeData,uVar32 - 1,0);
                fVar45 = ABS(aVar39 - (((fVar46 - aVar44) * (aVar39 - aVar41)) / (aVar43 - aVar44) +
                                      aVar41));
                if (180.0 <= fVar45) {
                  if ((aVar43 != fVar46) || (NAN(aVar43) || NAN(fVar46))) {
                    dVar3 = floor((double)fVar45 / 90.0);
                    fVar40 = (aVar43 - fVar46) / (float)(int)dVar3 + fVar46;
                    if (fVar42 <= fVar40) {
                      fVar40 = fVar42;
                    }
                  }
                }
              }
            }
            pCVar28 = entries.
                      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            fVar46 = fVar40;
          } while (fVar40 <= 1e+19);
          std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
          ~vector(&transforms);
          paVar33 = resultTrafos.
                    super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          paVar34 = resultTrafos.
                    super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (resultTrafos.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl
              .super__Vector_impl_data._M_start ==
              resultTrafos.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl
              .super__Vector_impl_data._M_finish) goto LAB_003e0630;
          pTVar16 = (pointer)operator_new(0x438);
          *(undefined4 *)&(pTVar16->mID)._M_dataplus._M_p = 0;
          *(undefined1 *)((long)&(pTVar16->mID)._M_dataplus._M_p + 4) = 0;
          memset((void *)((long)&(pTVar16->mID)._M_dataplus._M_p + 5),0x1b,0x3ff);
          sVar7 = nodeName._M_string_length;
          pTVar16[10].mID._M_string_length = 0;
          *(undefined4 *)&pTVar16[10].mID.field_2 = 0;
          pTVar16[9].f[0xe] = 0.0;
          pTVar16[9].f[0xf] = 0.0;
          *(undefined8 *)&pTVar16[9].field_0x64 = 0;
          *(undefined8 *)((long)&pTVar16[10].mID.field_2 + 8) = 0;
          pTVar16[10].mType = TF_LOOKAT;
          pTVar16[10].f[0] = 0.0;
          transforms.
          super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
          ._M_impl.super__Vector_impl_data._M_start = pTVar16;
          if (nodeName._M_string_length < 0x400) {
            *(int *)&(pTVar16->mID)._M_dataplus._M_p = (int)nodeName._M_string_length;
            memcpy((void *)((long)&(pTVar16->mID)._M_dataplus._M_p + 4),nodeName._M_dataplus._M_p,
                   nodeName._M_string_length);
            *(undefined1 *)((long)pTVar16->f + (sVar7 - 0x20)) = 0;
          }
          uVar29 = (long)paVar33 - (long)paVar34 >> 6;
          aVar39 = (ai_real)uVar29;
          pTVar16[9].f[0xe] = aVar39;
          *(ai_real *)&pTVar16[10].mID._M_dataplus._M_p = aVar39;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar29;
          *(ai_real *)&pTVar16[10].mID.field_2 = aVar39;
          uVar32 = SUB168(auVar2 * ZEXT816(0x18),0);
          if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
            uVar32 = 0xffffffffffffffff;
          }
          pvVar17 = operator_new__(uVar32);
          lVar12 = 0;
          do {
            *(undefined4 *)((long)pvVar17 + lVar12 + 0x10) = 0;
            *(undefined8 *)((long)pvVar17 + lVar12) = 0;
            ((undefined8 *)((long)pvVar17 + lVar12))[1] = 0;
            lVar12 = lVar12 + 0x18;
          } while (uVar29 * 0x18 - lVar12 != 0);
          *(void **)(pTVar16[9].f + 0xf) = pvVar17;
          puVar18 = (undefined8 *)operator_new__(uVar32);
          puVar27 = puVar18;
          do {
            *puVar27 = 0;
            puVar27[1] = 0x3f800000;
            puVar27[2] = 0;
            puVar27 = puVar27 + 3;
          } while (puVar27 != puVar18 + uVar29 * 3);
          pTVar16[10].mID._M_string_length = (size_type)puVar18;
          pvVar17 = operator_new__(uVar32);
          lVar12 = 0;
          do {
            *(undefined4 *)((long)pvVar17 + lVar12 + 0x10) = 0;
            *(undefined8 *)((long)pvVar17 + lVar12) = 0;
            ((undefined8 *)((long)pvVar17 + lVar12))[1] = 0;
            lVar12 = lVar12 + 0x18;
          } while (uVar29 * 0x18 - lVar12 != 0);
          *(void **)((long)&pTVar16[10].mID.field_2 + 8) = pvVar17;
          lVar12 = 8;
          lVar37 = 0;
          for (uVar32 = 0; uVar32 < (ulong)((long)paVar33 - (long)paVar34 >> 6); uVar32 = uVar32 + 1
              ) {
            puVar27 = (undefined8 *)((long)&paVar34->a1 + lVar37);
            mat._0_8_ = *puVar27;
            mat._8_8_ = puVar27[1];
            puVar27 = (undefined8 *)((long)&paVar34->b1 + lVar37);
            mat._16_8_ = *puVar27;
            mat._24_8_ = puVar27[1];
            puVar27 = (undefined8 *)((long)&paVar34->c1 + lVar37);
            mat._32_8_ = *puVar27;
            mat._40_8_ = puVar27[1];
            puVar27 = (undefined8 *)((long)&paVar34->d1 + lVar37);
            mat._48_8_ = *puVar27;
            uVar4 = puVar27[1];
            mat.d4 = (float)((ulong)uVar4 >> 0x20);
            dVar3 = (double)mat.d4;
            mat.d3 = (float)uVar4;
            mat.d4 = 1.0;
            *(double *)
             (*(long *)(transforms.
                        super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                        ._M_impl.super__Vector_impl_data._M_start[9].f + 0xf) + -8 + lVar12) = dVar3
            ;
            *(double *)
             ((transforms.
               super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
               ._M_impl.super__Vector_impl_data._M_start[10].mID._M_string_length - 8) + lVar12) =
                 dVar3;
            *(double *)
             (*(long *)((long)&transforms.
                               super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                               ._M_impl.super__Vector_impl_data._M_start[10].mID.field_2 + 8) + -8 +
             lVar12) = dVar3;
            aiMatrix4x4t<float>::Decompose
                      (&mat,(aiVector3t<float> *)
                            (*(long *)((long)&transforms.
                                              super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                                              ._M_impl.super__Vector_impl_data._M_start[10].mID.
                                              field_2 + 8) + lVar12),
                       (aiQuaterniont<float> *)
                       (transforms.
                        super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                        ._M_impl.super__Vector_impl_data._M_start[10].mID._M_string_length + lVar12)
                       ,(aiVector3t<float> *)
                        (*(long *)(transforms.
                                   super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                                   ._M_impl.super__Vector_impl_data._M_start[9].f + 0xf) + lVar12));
            lVar37 = lVar37 + 0x40;
            lVar12 = lVar12 + 0x18;
            paVar33 = resultTrafos.
                      super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            paVar34 = resultTrafos.
                      super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                    (&anims,(value_type *)&transforms);
        }
        if ((entries.
             super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             entries.
             super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((entries.
             super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
             ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount != 0)) {
          mat.a1 = 0.0;
          mat.a2 = 0.0;
          mat.a3 = 0.0;
          mat.a4 = 0.0;
          mat.b1 = 0.0;
          mat.b2 = 0.0;
          for (psVar38 = &(entries.
                           super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start)->mTargetId; lVar37 = mat._8_8_
              , lVar12 = mat._0_8_,
              (value_type *)((long)(psVar38 + -1) + 0x18) !=
              entries.
              super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
              psVar38 = (string *)((long)(psVar38 + 3) + 0x18)) {
            if ((psVar38->_M_string_length != 0) &&
               (lVar12 = std::__cxx11::string::find((char *)psVar38,0x5a644d), lVar12 != -1)) {
              std::
              vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ::push_back((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                           *)&mat,(value_type *)((long)(psVar38 + -1) + 0x18));
            }
          }
          if (mat._8_8_ != mat._0_8_) {
            paVar19 = (aiMeshMorphAnim *)operator_new(0x410);
            (paVar19->mName).length = 0;
            (paVar19->mName).data[0] = '\0';
            memset((paVar19->mName).data + 1,0x1b,0x3ff);
            sVar7 = nodeName._M_string_length;
            paVar19->mNumKeys = 0;
            paVar19->mKeys = (aiMeshMorphKey *)0x0;
            morphAnim = paVar19;
            if (nodeName._M_string_length < 0x400) {
              (paVar19->mName).length = (ai_uint32)nodeName._M_string_length;
              memcpy((paVar19->mName).data,nodeName._M_dataplus._M_p,nodeName._M_string_length);
              (paVar19->mName).data[sVar7] = '\0';
            }
            transforms.
            super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            transforms.
            super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            transforms.
            super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            uVar30 = 0;
            for (; paVar19 = morphAnim, lVar12 != lVar37; lVar12 = lVar12 + 0x78) {
              cVar31 = (char)lVar12 + '\b';
              lVar37 = std::__cxx11::string::find(cVar31,0x28);
              lVar20 = std::__cxx11::string::find(cVar31,0x29);
              if ((lVar37 != -1) && (lVar20 != -1)) {
                uVar35 = 0;
                while( true ) {
                  uVar32 = (ulong)uVar35;
                  lVar37 = *(long *)(lVar12 + 0x60);
                  if ((ulong)(*(long *)(lVar37 + 0x10) - *(long *)(lVar37 + 8) >> 2) <= uVar32)
                  break;
                  pvVar21 = std::vector<float,_std::allocator<float>_>::at
                                      ((vector<float,_std::allocator<float>_> *)(lVar37 + 8),uVar32)
                  ;
                  fVar46 = *pvVar21;
                  pvVar21 = std::vector<float,_std::allocator<float>_>::at
                                      ((vector<float,_std::allocator<float>_> *)
                                       (*(long *)(lVar12 + 0x70) + 8),uVar32);
                  insertMorphTimeValue
                            ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                              *)&transforms,fVar46,*pvVar21,uVar30);
                  uVar35 = uVar35 + 1;
                }
                uVar30 = uVar30 + 1;
              }
              lVar37 = mat._8_8_;
            }
            uVar32 = (long)transforms.
                           super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)transforms.
                           super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            morphAnim->mNumKeys = (uint)uVar32;
            uVar32 = uVar32 & 0xffffffff;
            puVar22 = (ulong *)operator_new__(uVar32 * 0x20 + 8);
            *puVar22 = uVar32;
            if (uVar32 != 0) {
              lVar12 = 0;
              do {
                puVar27 = (undefined8 *)((long)puVar22 + lVar12 + 0x14);
                *puVar27 = 0;
                puVar27[1] = 0;
                puVar27 = (undefined8 *)((long)&((aiMeshMorphKey *)(puVar22 + 1))->mTime + lVar12);
                *puVar27 = 0;
                puVar27[1] = 0;
                lVar12 = lVar12 + 0x20;
              } while (uVar32 * 0x20 != lVar12);
            }
            paVar19->mKeys = (aiMeshMorphKey *)(puVar22 + 1);
            for (uVar32 = 0; uVar32 < paVar19->mNumKeys; uVar32 = uVar32 + 1) {
              paVar19->mKeys[uVar32].mNumValuesAndWeights = (uint)((lVar37 - mat._0_8_) / 0x78);
              uVar29 = (long)(mat._8_8_ - mat._0_8_) / 0x78;
              puVar23 = (uint *)operator_new__(-(ulong)(uVar29 >> 0x3e != 0) | uVar29 * 4);
              morphAnim->mKeys[uVar32].mValues = puVar23;
              uVar24 = (long)(mat._8_8_ - mat._0_8_) / 0x78;
              uVar29 = uVar24 * 8;
              if (0x1fffffffffffffff < uVar24) {
                uVar29 = 0xffffffffffffffff;
              }
              pdVar25 = (double *)operator_new__(uVar29);
              morphAnim->mKeys[uVar32].mWeights = pdVar25;
              morphAnim->mKeys[uVar32].mTime =
                   (double)(transforms.
                            super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                            ._M_impl.super__Vector_impl_data._M_start)->f[uVar32 * 8 + -9];
              for (uVar30 = 0; uVar29 = (ulong)uVar30,
                  uVar29 < (ulong)((long)(mat._8_8_ - mat._0_8_) / 0x78); uVar30 = uVar30 + 1) {
                morphAnim->mKeys[uVar32].mValues[uVar29] = uVar30;
                fVar46 = getWeightAtKey((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                                         *)&transforms,(int)uVar32,uVar30);
                morphAnim->mKeys[uVar32].mWeights[uVar29] = (double)fVar46;
              }
              paVar19 = morphAnim;
              lVar37 = mat._8_8_;
            }
            std::vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_>::push_back
                      (&morphAnims,&morphAnim);
            std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::~vector
                      ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *)
                       &transforms);
          }
          std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
          ::~vector((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     *)&mat);
        }
        std::_Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::~_Vector_base
                  (&resultTrafos.
                    super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>);
      }
      std::__cxx11::string::~string((string *)&subElement);
      std::__cxx11::string::~string((string *)&targetID);
    }
    std::__cxx11::string::~string((string *)&nodeName);
    std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
    ~vector(&entries);
    ppaVar10 = ppaVar10 + 1;
  } while( true );
}

Assistant:

void ColladaLoader::CreateAnimation(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string& pName)
{
    // collect a list of animatable nodes
    std::vector<const aiNode*> nodes;
    CollectNodes(pScene->mRootNode, nodes);

    std::vector<aiNodeAnim*> anims;
    std::vector<aiMeshMorphAnim*> morphAnims;

    for (std::vector<const aiNode*>::const_iterator nit = nodes.begin(); nit != nodes.end(); ++nit)
    {
        // find all the collada anim channels which refer to the current node
        std::vector<Collada::ChannelEntry> entries;
        std::string nodeName = (*nit)->mName.data;

        // find the collada node corresponding to the aiNode
        const Collada::Node* srcNode = FindNode(pParser.mRootNode, nodeName);
        //      ai_assert( srcNode != NULL);
        if (!srcNode)
            continue;

        // now check all channels if they affect the current node
        std::string targetID, subElement;
        for (std::vector<Collada::AnimationChannel>::const_iterator cit = pSrcAnim->mChannels.begin();
            cit != pSrcAnim->mChannels.end(); ++cit)
        {
            const Collada::AnimationChannel& srcChannel = *cit;
            Collada::ChannelEntry entry;

            // we expect the animation target to be of type "nodeName/transformID.subElement". Ignore all others
            // find the slash that separates the node name - there should be only one
            std::string::size_type slashPos = srcChannel.mTarget.find('/');
            if (slashPos == std::string::npos)
            {
                std::string::size_type targetPos = srcChannel.mTarget.find(srcNode->mID);
                if (targetPos == std::string::npos)
                    continue;

                // not node transform, but something else. store as unknown animation channel for now
                entry.mChannel = &(*cit);
                entry.mTargetId = srcChannel.mTarget.substr(targetPos + pSrcAnim->mName.length(),
                    srcChannel.mTarget.length() - targetPos - pSrcAnim->mName.length());
                if (entry.mTargetId.front() == '-')
                    entry.mTargetId = entry.mTargetId.substr(1);
                entries.push_back(entry);
                continue;
            }
            if (srcChannel.mTarget.find('/', slashPos + 1) != std::string::npos)
                continue;

            targetID.clear();
            targetID = srcChannel.mTarget.substr(0, slashPos);
            if (targetID != srcNode->mID)
                continue;

            // find the dot that separates the transformID - there should be only one or zero
            std::string::size_type dotPos = srcChannel.mTarget.find('.');
            if (dotPos != std::string::npos)
            {
                if (srcChannel.mTarget.find('.', dotPos + 1) != std::string::npos)
                    continue;

                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, dotPos - slashPos - 1);

                subElement.clear();
                subElement = srcChannel.mTarget.substr(dotPos + 1);
                if (subElement == "ANGLE")
                    entry.mSubElement = 3; // last number in an Axis-Angle-Transform is the angle
                else if (subElement == "X")
                    entry.mSubElement = 0;
                else if (subElement == "Y")
                    entry.mSubElement = 1;
                else if (subElement == "Z")
                    entry.mSubElement = 2;
                else
                    ASSIMP_LOG_WARN_F("Unknown anim subelement <", subElement, ">. Ignoring");
            }
            else {
                // no subelement following, transformId is remaining string
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1);
            }

            std::string::size_type bracketPos = srcChannel.mTarget.find('(');
            if (bracketPos != std::string::npos)
            {
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, bracketPos - slashPos - 1);
                subElement.clear();
                subElement = srcChannel.mTarget.substr(bracketPos);

                if (subElement == "(0)(0)")
                    entry.mSubElement = 0;
                else if (subElement == "(1)(0)")
                    entry.mSubElement = 1;
                else if (subElement == "(2)(0)")
                    entry.mSubElement = 2;
                else if (subElement == "(3)(0)")
                    entry.mSubElement = 3;
                else if (subElement == "(0)(1)")
                    entry.mSubElement = 4;
                else if (subElement == "(1)(1)")
                    entry.mSubElement = 5;
                else if (subElement == "(2)(1)")
                    entry.mSubElement = 6;
                else if (subElement == "(3)(1)")
                    entry.mSubElement = 7;
                else if (subElement == "(0)(2)")
                    entry.mSubElement = 8;
                else if (subElement == "(1)(2)")
                    entry.mSubElement = 9;
                else if (subElement == "(2)(2)")
                    entry.mSubElement = 10;
                else if (subElement == "(3)(2)")
                    entry.mSubElement = 11;
                else if (subElement == "(0)(3)")
                    entry.mSubElement = 12;
                else if (subElement == "(1)(3)")
                    entry.mSubElement = 13;
                else if (subElement == "(2)(3)")
                    entry.mSubElement = 14;
                else if (subElement == "(3)(3)")
                    entry.mSubElement = 15;
            }

            // determine which transform step is affected by this channel
            entry.mTransformIndex = SIZE_MAX;
            for (size_t a = 0; a < srcNode->mTransforms.size(); ++a)
                if (srcNode->mTransforms[a].mID == entry.mTransformId)
                    entry.mTransformIndex = a;

            if (entry.mTransformIndex == SIZE_MAX)
            {
                if (entry.mTransformId.find("morph-weights") != std::string::npos)
                {
                    entry.mTargetId = entry.mTransformId;
                    entry.mTransformId = "";
                }
                else
                    continue;
            }

            entry.mChannel = &(*cit);
            entries.push_back(entry);
        }

        // if there's no channel affecting the current node, we skip it
        if (entries.empty())
            continue;

        // resolve the data pointers for all anim channels. Find the minimum time while we're at it
        ai_real startTime = ai_real(1e20), endTime = ai_real(-1e20);
        for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
        {
            Collada::ChannelEntry& e = *it;
            e.mTimeAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceTimes);
            e.mTimeData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mTimeAccessor->mSource);
            e.mValueAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceValues);
            e.mValueData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mValueAccessor->mSource);

            // time count and value count must match
            if (e.mTimeAccessor->mCount != e.mValueAccessor->mCount)
                throw DeadlyImportError(format() << "Time count / value count mismatch in animation channel \"" << e.mChannel->mTarget << "\".");

            if (e.mTimeAccessor->mCount > 0)
            {
                // find bounding times
                startTime = std::min(startTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, 0, 0));
                endTime = std::max(endTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, e.mTimeAccessor->mCount - 1, 0));
            }
        }

        std::vector<aiMatrix4x4> resultTrafos;
        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            // create a local transformation chain of the node's transforms
            std::vector<Collada::Transform> transforms = srcNode->mTransforms;

            // now for every unique point in time, find or interpolate the key values for that time
            // and apply them to the transform chain. Then the node's present transformation can be calculated.
            ai_real time = startTime;
            while (1)
            {
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;

                    // find the keyframe behind the current point in time
                    size_t pos = 0;
                    ai_real postTime = 0.0;
                    while (1)
                    {
                        if (pos >= e.mTimeAccessor->mCount)
                            break;
                        postTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos, 0);
                        if (postTime >= time)
                            break;
                        ++pos;
                    }

                    pos = std::min(pos, e.mTimeAccessor->mCount - 1);

                    // read values from there
                    ai_real temp[16];
                    for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        temp[c] = ReadFloat(*e.mValueAccessor, *e.mValueData, pos, c);

                    // if not exactly at the key time, interpolate with previous value set
                    if (postTime > time && pos > 0)
                    {
                        ai_real preTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos - 1, 0);
                        ai_real factor = (time - postTime) / (preTime - postTime);

                        for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        {
                            ai_real v = ReadFloat(*e.mValueAccessor, *e.mValueData, pos - 1, c);
                            temp[c] += (v - temp[c]) * factor;
                        }
                    }

                    // Apply values to current transformation
                    std::copy(temp, temp + e.mValueAccessor->mSize, transforms[e.mTransformIndex].f + e.mSubElement);
                }

                // Calculate resulting transformation
                aiMatrix4x4 mat = pParser.CalculateResultTransform(transforms);

                // out of laziness: we store the time in matrix.d4
                mat.d4 = time;
                resultTrafos.push_back(mat);

                // find next point in time to evaluate. That's the closest frame larger than the current in any channel
                ai_real nextTime = ai_real(1e20);
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& channelElement = *it;

                    // find the next time value larger than the current
                    size_t pos = 0;
                    while (pos < channelElement.mTimeAccessor->mCount)
                    {
                        const ai_real t = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        if (t > time)
                        {
                            nextTime = std::min(nextTime, t);
                            break;
                        }
                        ++pos;
                    }

                    // https://github.com/assimp/assimp/issues/458
                    // Sub-sample axis-angle channels if the delta between two consecutive
                    // key-frame angles is >= 180 degrees.
                    if (transforms[channelElement.mTransformIndex].mType == Collada::TF_ROTATE && channelElement.mSubElement == 3 && pos > 0 && pos < channelElement.mTimeAccessor->mCount) {
                        const ai_real cur_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos, 0);
                        const ai_real last_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos - 1, 0);
                        const ai_real cur_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        const ai_real last_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos - 1, 0);
                        const ai_real last_eval_angle = last_key_angle + (cur_key_angle - last_key_angle) * (time - last_key_time) / (cur_key_time - last_key_time);
                        const ai_real delta = std::abs(cur_key_angle - last_eval_angle);
                        if (delta >= 180.0) {
                            const int subSampleCount = static_cast<int>(std::floor(delta / 90.0));
                            if (cur_key_time != time) {
                                const ai_real nextSampleTime = time + (cur_key_time - time) / subSampleCount;
                                nextTime = std::min(nextTime, nextSampleTime);
                            }
                        }
                    }
                }

                // no more keys on any channel after the current time -> we're done
                if (nextTime > 1e19)
                    break;

                // else construct next keyframe at this following time point
                time = nextTime;
            }
        }

        // there should be some keyframes, but we aren't that fixated on valid input data
//      ai_assert( resultTrafos.size() > 0);

        // build an animation channel for the given node out of these trafo keys
        if (!resultTrafos.empty())
        {
            aiNodeAnim* dstAnim = new aiNodeAnim;
            dstAnim->mNodeName = nodeName;
            dstAnim->mNumPositionKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumRotationKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumScalingKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mPositionKeys = new aiVectorKey[resultTrafos.size()];
            dstAnim->mRotationKeys = new aiQuatKey[resultTrafos.size()];
            dstAnim->mScalingKeys = new aiVectorKey[resultTrafos.size()];

            for (size_t a = 0; a < resultTrafos.size(); ++a)
            {
                aiMatrix4x4 mat = resultTrafos[a];
                double time = double(mat.d4); // remember? time is stored in mat.d4
                mat.d4 = 1.0f;

                dstAnim->mPositionKeys[a].mTime = time;
                dstAnim->mRotationKeys[a].mTime = time;
                dstAnim->mScalingKeys[a].mTime = time;
                mat.Decompose(dstAnim->mScalingKeys[a].mValue, dstAnim->mRotationKeys[a].mValue, dstAnim->mPositionKeys[a].mValue);
            }

            anims.push_back(dstAnim);
        }
        else
        {
            ASSIMP_LOG_WARN("Collada loader: found empty animation channel, ignored. Please check your exporter.");
        }

        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            std::vector<Collada::ChannelEntry> morphChannels;
            for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
            {
                Collada::ChannelEntry& e = *it;

                // skip non-transform types
                if (e.mTargetId.empty())
                    continue;

                if (e.mTargetId.find("morph-weights") != std::string::npos)
                    morphChannels.push_back(e);
            }
            if (morphChannels.size() > 0)
            {
                // either 1) morph weight animation count should contain morph target count channels
                // or     2) one channel with morph target count arrays
                // assume first

                aiMeshMorphAnim *morphAnim = new aiMeshMorphAnim;
                morphAnim->mName.Set(nodeName);

                std::vector<MorphTimeValues> morphTimeValues;

                int morphAnimChannelIndex = 0;
                for (std::vector<Collada::ChannelEntry>::iterator it = morphChannels.begin(); it != morphChannels.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;
                    std::string::size_type apos = e.mTargetId.find('(');
                    std::string::size_type bpos = e.mTargetId.find(')');
                    if (apos == std::string::npos || bpos == std::string::npos)
                        // unknown way to specify weight -> ignore this animation
                        continue;

                    // weight target can be in format Weight_M_N, Weight_N, WeightN, or some other way
                    // we ignore the name and just assume the channels are in the right order
                    for (unsigned int i = 0; i < e.mTimeData->mValues.size(); i++)
                        insertMorphTimeValue(morphTimeValues, e.mTimeData->mValues.at(i), e.mValueData->mValues.at(i), morphAnimChannelIndex);

                    ++morphAnimChannelIndex;
                }

                morphAnim->mNumKeys = static_cast<unsigned int>(morphTimeValues.size());
                morphAnim->mKeys = new aiMeshMorphKey[morphAnim->mNumKeys];
                for (unsigned int key = 0; key < morphAnim->mNumKeys; key++)
                {
                    morphAnim->mKeys[key].mNumValuesAndWeights = static_cast<unsigned int>(morphChannels.size());
                    morphAnim->mKeys[key].mValues = new unsigned int[morphChannels.size()];
                    morphAnim->mKeys[key].mWeights = new double[morphChannels.size()];

                    morphAnim->mKeys[key].mTime = morphTimeValues[key].mTime;
                    for (unsigned int valueIndex = 0; valueIndex < morphChannels.size(); valueIndex++)
                    {
                        morphAnim->mKeys[key].mValues[valueIndex] = valueIndex;
                        morphAnim->mKeys[key].mWeights[valueIndex] = getWeightAtKey(morphTimeValues, key, valueIndex);
                    }
                }

                morphAnims.push_back(morphAnim);
            }
        }
    }

    if (!anims.empty() || !morphAnims.empty())
    {
        aiAnimation* anim = new aiAnimation;
        anim->mName.Set(pName);
        anim->mNumChannels = static_cast<unsigned int>(anims.size());
        if (anim->mNumChannels > 0)
        {
            anim->mChannels = new aiNodeAnim*[anims.size()];
            std::copy(anims.begin(), anims.end(), anim->mChannels);
        }
        anim->mNumMorphMeshChannels = static_cast<unsigned int>(morphAnims.size());
        if (anim->mNumMorphMeshChannels > 0)
        {
            anim->mMorphMeshChannels = new aiMeshMorphAnim*[anim->mNumMorphMeshChannels];
            std::copy(morphAnims.begin(), morphAnims.end(), anim->mMorphMeshChannels);
        }
        anim->mDuration = 0.0f;
        for (size_t a = 0; a < anims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, anims[a]->mPositionKeys[anims[a]->mNumPositionKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mRotationKeys[anims[a]->mNumRotationKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mScalingKeys[anims[a]->mNumScalingKeys - 1].mTime);
        }
        for (size_t a = 0; a < morphAnims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, morphAnims[a]->mKeys[morphAnims[a]->mNumKeys - 1].mTime);
        }
        anim->mTicksPerSecond = 1;
        mAnims.push_back(anim);
    }
}